

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

string * __thiscall
compiler::AssemblerCompiler::do_assignment_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Assignment *assignment)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  socklen_t *in_RCX;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  char *pcVar9;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  Var local_70;
  long local_48;
  long local_40;
  long lStack_38;
  
  (*(assignment->expression->super_Object)._vptr_Object[1])(&local_70);
  iVar2 = std::__cxx11::string::compare((char *)&local_70);
  if (local_70.super_Expression.super_Object._vptr_Object != (Object)&local_70.name._M_string_length
     ) {
    operator_delete((void *)local_70.super_Expression.super_Object._vptr_Object,
                    local_70.name._M_string_length + 1);
  }
  pcVar9 = "MOV ";
  if (iVar2 == 0) {
    pcVar9 = "MOVC ";
  }
  Var::accept_abi_cxx11_(&local_70,(int)assignment->variable,(sockaddr *)this,in_RCX);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar9);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_70.name.field_2._8_8_ = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_70.name.field_2._8_8_ = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_70.name.field_2._M_local_buf + 8);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_a0 = *puVar6;
    uStack_98 = (undefined4)plVar3[3];
    uStack_94 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (**(assignment->expression->super_Object)._vptr_Object)(&local_90,assignment->expression,this);
  uVar8 = 0xf;
  if (local_b0 != &local_a0) {
    uVar8 = local_a0;
  }
  if (uVar8 < (ulong)(local_88 + local_a8)) {
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if ((ulong)(local_88 + local_a8) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_001029de;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_001029de:
  local_d0 = &local_c0;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_c0 = *plVar3;
    uStack_b8 = puVar4[3];
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((long *)local_70.name.field_2._8_8_ != &local_40) {
    operator_delete((void *)local_70.name.field_2._8_8_,local_40 + 1);
  }
  if (local_70.super_Expression.super_Object._vptr_Object != (Object)&local_70.name._M_string_length
     ) {
    operator_delete((void *)local_70.super_Expression.super_Object._vptr_Object,
                    local_70.name._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_assignment(const Assignment *assignment) {
    auto common_prefix = [&] {
        if (assignment->expression->describe() == "Const") {
            return "MOVC ";
        } else {
            return "MOV ";
        }
    };
    return common_prefix() + assignment->variable->accept(this) + " " + assignment->expression->accept(this) + ";";
}